

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::setOptions(QMessageBox *this,Options options)

{
  bool bVar1;
  Options lhs;
  QMessageDialogOptions *this_00;
  QFlagsStorage<QMessageBox::Option> in_ESI;
  QMessageBox *in_RDI;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  Option in_stack_ffffffffffffffbc;
  QFlagsStorage<QMessageBox::Option> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = in_ESI.i;
  d_func((QMessageBox *)0x7a59ce);
  lhs = QMessageBox::options(in_RDI);
  bVar1 = ::operator==((QFlags<QMessageBox::Option>)
                       lhs.super_QFlagsStorageHelper<QMessageBox::Option,_4>.
                       super_QFlagsStorage<QMessageBox::Option>.i,
                       (QFlags<QMessageBox::Option>)local_c.i);
  if (!bVar1) {
    this_00 = QSharedPointer<QMessageDialogOptions>::operator->
                        ((QSharedPointer<QMessageDialogOptions> *)0x7a5a0f);
    ::QFlags::operator_cast_to_int((QFlags *)&local_c);
    QFlags<QMessageDialogOptions::Option>::QFlags
              ((QFlags<QMessageDialogOptions::Option> *)this_00,in_stack_ffffffffffffffbc);
    QMessageDialogOptions::setOptions((QFlags_conflict1 *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBox::setOptions(QMessageBox::Options options)
{
    Q_D(QMessageBox);

    if (QMessageBox::options() == options)
        return;

    d->options->setOptions(QMessageDialogOptions::Option(int(options)));
}